

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

string * __thiscall
CharacterInstance::representation_abi_cxx11_(string *__return_storage_ptr__,CharacterInstance *this)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct((ulong)local_38,'\x01');
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_38,0,(char *)0x0,0x15b1d3);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_48 = *plVar3;
    lStack_40 = plVar2[3];
    local_58 = &local_48;
  }
  else {
    local_48 = *plVar3;
    local_58 = (long *)*plVar2;
  }
  local_50 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_58);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_58 != &local_48) {
    operator_delete(local_58);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CharacterInstance::representation() const {
    return "'" + std::string(1, _value) + "'";
}